

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroProp.cpp
# Opt level: O2

Vector3d * __thiscall
OpenMD::HydroProp::getCenterOfPitch(Vector3d *__return_storage_ptr__,HydroProp *this)

{
  Vector3d cop;
  Mat3x3d P;
  Vector<double,_3U> local_98;
  Vector<double,_3U> local_80;
  Mat3x3d local_68;
  
  getPitchMatrix(&local_68,this);
  Vector<double,_3U>::Vector(&local_98);
  local_98.data_[0] =
       (local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] -
       local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1]) * 0.5;
  local_98.data_[1] =
       (local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] -
       local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2]) * 0.5;
  local_98.data_[2] =
       (local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] -
       local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0]) * 0.5;
  OpenMD::operator+(&local_80,&(this->cor_).super_Vector<double,_3U>,&local_98);
  Vector<double,_3U>::Vector(&__return_storage_ptr__->super_Vector<double,_3U>,&local_80);
  return __return_storage_ptr__;
}

Assistant:

Vector3d HydroProp::getCenterOfPitch() {
    Mat3x3d P = getPitchMatrix();
    Vector3d cop;
    cop[0] = 0.5 * (P(1, 2) - P(2, 1));
    cop[1] = 0.5 * (P(2, 0) - P(0, 2));
    cop[2] = 0.5 * (P(0, 1) - P(1, 0));
    // Assume Xi_ was stored at center of resistance, so center of
    // pitch is returned relative to origin if center of resistance is
    // not the origin:
    return (cor_ + cop);
  }